

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::OutputRedirectTest_FlushErrorInRestoreAndRead_Test::TestBody
          (OutputRedirectTest_FlushErrorInRestoreAndRead_Test *this)

{
  bool bVar1;
  FILE *__stream;
  AssertHelper *this_00;
  int __fd2;
  system_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  OutputRedirect redir;
  buffered_file f;
  file write_copy;
  int write_fd;
  file write_end;
  file read_end;
  OutputRedirect *in_stack_00000ee8;
  char *in_stack_fffffffffffffea8;
  basic_string_view<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  OutputRedirect *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  Type in_stack_fffffffffffffedc;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  string local_98 [32];
  AssertionResult local_78 [2];
  int local_58;
  undefined1 local_51;
  AssertionResult local_50 [2];
  buffered_file local_30;
  file local_24;
  int local_20;
  file local_10;
  file local_c [3];
  
  fmt::v5::file::file(local_c);
  fmt::v5::file::file(&local_10);
  fmt::v5::file::pipe(local_c,&local_10.fd_);
  local_20 = fmt::v5::file::descriptor(&local_10);
  fmt::v5::file::dup(&local_24,local_20);
  fmt::v5::file::fdopen((file *)&local_30,(int)&local_10,"w");
  fmt::v5::buffered_file::get(&local_30);
  OutputRedirect::OutputRedirect
            ((OutputRedirect *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (FILE *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_51 = 0x78;
  __stream = (FILE *)fmt::v5::buffered_file::get(&local_30);
  local_58 = fputc(0x78,__stream);
  testing::internal::EqHelper<false>::Compare<char,int>
            ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (int *)in_stack_fffffffffffffeb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::AssertionResult::failure_message((AssertionResult *)0x121093);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               (char *)in_stack_fffffffffffffec0);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff30,
               (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0x1210f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121161);
  close(local_20);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (bVar1) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    format_system_error_abi_cxx11_(gtest_ar._4_4_,stack0x00000110);
    in_stack_fffffffffffffee7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffee7) {
      OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ee8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (char (*) [111])CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_ffffffffffffff2c = 2;
    std::__cxx11::string::~string(local_98);
    if (in_stack_ffffffffffffff2c == 0) goto LAB_00121531;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1214a1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             (char *)in_stack_fffffffffffffec0);
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff30,
             (Message *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x1214ef);
LAB_00121531:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12153e);
  fmt::v5::file::dup2(&local_24,local_20,__fd2);
  OutputRedirect::~OutputRedirect(in_stack_fffffffffffffec0);
  fmt::v5::buffered_file::~buffered_file((buffered_file *)in_stack_fffffffffffffec0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffec0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffec0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

TEST(OutputRedirectTest, FlushErrorInRestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  OutputRedirect redir(f.get());
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  FMT_POSIX(close(write_fd));
  EXPECT_SYSTEM_ERROR_NOASSERT(redir.restore_and_read(),
      EBADF, "cannot flush stream");
  write_copy.dup2(write_fd);  // "undo" close or dtor will fail
}